

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O2

vm_obj_id_t
CVmObjFileName::combine_path(char *path,size_t pathl,char *file,size_t filel,int literal)

{
  undefined8 uVar1;
  void *pvVar2;
  vm_obj_id_t vVar3;
  undefined8 *puVar4;
  long *plVar5;
  ulong uVar6;
  char *dir;
  char *fname;
  char *buf;
  size_t len;
  size_t len_00;
  err_frame_t err_cur__;
  uint local_110 [2];
  undefined8 local_108;
  void *local_100;
  __jmp_buf_tag local_f8;
  
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  local_108 = *puVar4;
  plVar5 = (long *)_ZTW11G_err_frame();
  *plVar5 = (long)local_110;
  local_110[0] = _setjmp(&local_f8);
  if (local_110[0] == 0) {
    uVar6 = pathl + filel + 0x20;
    len_00 = 0x1000;
    if (0x1000 < uVar6) {
      len_00 = uVar6;
    }
    dir = lib_copy_str(path,pathl);
    fname = lib_copy_str(file,filel);
    buf = lib_alloc_str(len_00);
    fn_build_full_path(buf,len_00,dir,fname,literal);
    len = strlen(buf);
    vVar3 = create_from_local(buf,len);
  }
  else {
    vVar3 = 0;
    buf = (char *)0x0;
    fname = buf;
    dir = buf;
  }
  if (-1 < (short)local_110[0]) {
    local_110[0] = local_110[0] | 0x8000;
    lib_free_str(buf);
    lib_free_str(dir);
    lib_free_str(fname);
  }
  uVar1 = local_108;
  puVar4 = (undefined8 *)_ZTW11G_err_frame();
  *puVar4 = uVar1;
  if ((local_110[0] & 0x4001) != 0) {
    puVar4 = (undefined8 *)_ZTW11G_err_frame();
    if ((*(byte *)*puVar4 & 2) != 0) {
      plVar5 = (long *)_ZTW11G_err_frame();
      free(*(void **)(*plVar5 + 0x10));
    }
    pvVar2 = local_100;
    plVar5 = (long *)_ZTW11G_err_frame();
    *(void **)(*plVar5 + 0x10) = pvVar2;
    err_rethrow();
  }
  if ((local_110[0] & 2) != 0) {
    free(local_100);
  }
  return vVar3;
}

Assistant:

vm_obj_id_t CVmObjFileName::combine_path(
    VMG_ const char *path, size_t pathl, const char *file, size_t filel,
    int literal)
{
    /* 
     *   Estimate the space we'll need for the combined result.  This is just
     *   the sum of the two sizes on most systems, plus a path separator.  On
     *   some older systems this might add a bit more overhead, such as VMS
     *   bracket notation for the directory.  Pad it out a bit to be safe.
     */
    size_t buflen = pathl + filel + 32;
    if (buflen < OSFNMAX)
        buflen = OSFNMAX;

    char *buf = 0, *pathz = 0, *filez = 0;
    vm_obj_id_t id = VM_INVALID_OBJ;
    err_try
    {
        /* allocate null-terminated copies of the source strings */
        pathz = lib_copy_str(path, pathl);
        filez = lib_copy_str(file, filel);

        /* allocate the result buffer */
        buf = lib_alloc_str(buflen);

        /* build the full path */
        fn_build_full_path(vmg_ buf, buflen, pathz, filez, literal);

        /* create the FileName for the combined path */
        id = create_from_local(vmg_ buf, strlen(buf));
    }